

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O1

ssize_t __thiscall
spdlog::details::file_helper::write(file_helper *this,int __fd,void *__buf,size_t __n)

{
  size_t __n_00;
  size_t sVar1;
  int *piVar2;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  __n_00 = *(size_t *)(CONCAT44(in_register_00000034,__fd) + 0x10);
  sVar1 = fwrite(*(void **)(CONCAT44(in_register_00000034,__fd) + 8),1,__n_00,(FILE *)this->fd_);
  if (sVar1 == __n_00) {
    return sVar1;
  }
  os::filename_to_str(&local_30,&this->filename_);
  std::operator+(&local_50,"Failed writing to file ",&local_30);
  piVar2 = __errno_location();
  throw_spdlog_ex(&local_50,*piVar2);
}

Assistant:

SPDLOG_INLINE void file_helper::write(const memory_buf_t &buf)
{
    size_t msg_size = buf.size();
    auto data = buf.data();
    if (std::fwrite(data, 1, msg_size, fd_) != msg_size)
    {
        throw_spdlog_ex("Failed writing to file " + os::filename_to_str(filename_), errno);
    }
}